

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.hpp
# Opt level: O2

ssize_t __thiscall
boost::deflate::detail::window::read(window *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  ulong uVar2;
  _Head_base<0UL,_unsigned_char_*,_false> __src;
  void *pvVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  
  pvVar3 = (void *)CONCAT44(in_register_00000034,__fd);
  lVar1 = (ulong)this->i_ - (long)__buf;
  if (this->i_ < this->size_) {
    uVar4 = (ulong)this->capacity_;
    uVar2 = (lVar1 + uVar4) % uVar4;
    uVar4 = uVar4 - uVar2;
    __src._M_head_impl =
         (this->p_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
         ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar2;
    if (uVar4 <= __nbytes && __nbytes - uVar4 != 0) {
      memcpy(pvVar3,__src._M_head_impl,uVar4);
      pvVar3 = (void *)((long)pvVar3 + uVar4);
      __src._M_head_impl =
           (this->p_)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      __nbytes = __nbytes - uVar4;
    }
  }
  else {
    __src._M_head_impl =
         (this->p_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
         ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar1;
  }
  pvVar3 = memcpy(pvVar3,__src._M_head_impl,__nbytes);
  return (ssize_t)pvVar3;
}

Assistant:

void
    read(std::uint8_t* out, std::size_t pos, std::size_t n)
    {
        if(i_ >= size_)
        {
            // window is contiguous
            std::memcpy(out, &p_[i_ - pos], n);
            return;
        }
        auto i = ((i_ - pos) + capacity_) % capacity_;
        auto m = capacity_ - i;
        if(n <= m)
        {
            std::memcpy(out, &p_[i], n);
            return;
        }
        std::memcpy(out, &p_[i], m);
        out += m;
        std::memcpy(out, &p_[0], n - m);
    }